

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O1

int x509_crt_check_parent(mbedtls_x509_crt *child,mbedtls_x509_crt *parent,int top,int bottom)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  mbedtls_asn1_named_data *pmVar10;
  size_t sVar11;
  mbedtls_asn1_named_data *pmVar12;
  
  pmVar12 = &child->issuer;
  pmVar10 = &parent->subject;
  iVar9 = -1;
  while( true ) {
    if (pmVar12 == (mbedtls_asn1_named_data *)0x0) {
      return -1;
    }
    if (pmVar10 == (mbedtls_x509_name *)0x0) {
      return -1;
    }
    if ((pmVar12->oid).tag != (pmVar10->oid).tag) {
      return -1;
    }
    sVar4 = (pmVar10->oid).len;
    if ((pmVar12->oid).len != sVar4) break;
    iVar7 = bcmp((pmVar12->oid).p,(pmVar10->oid).p,sVar4);
    if (iVar7 != 0) {
      return -1;
    }
    iVar7 = (pmVar12->val).tag;
    iVar3 = (pmVar10->val).tag;
    if (((iVar7 != iVar3) || (sVar4 = (pmVar10->val).len, (pmVar12->val).len != sVar4)) ||
       (iVar8 = bcmp((pmVar12->val).p,(pmVar10->val).p,sVar4), iVar8 != 0)) {
      if ((iVar7 != 0x13) && (iVar7 != 0xc)) {
        return -1;
      }
      if ((iVar3 != 0x13) && (iVar3 != 0xc)) {
        return -1;
      }
      sVar5 = (pmVar10->val).len;
      if ((pmVar12->val).len != sVar5) {
        return -1;
      }
      if (sVar5 != 0) {
        sVar11 = 0;
        do {
          bVar1 = (pmVar12->val).p[sVar11];
          bVar2 = (pmVar10->val).p[sVar11];
          if (bVar1 != bVar2) {
            if ((bVar2 ^ bVar1) != 0x20) {
              return -1;
            }
            if (0x19 < (byte)((bVar1 & 0xdf) + 0xbf)) {
              return -1;
            }
          }
          sVar11 = sVar11 + 1;
        } while (sVar5 != sVar11);
      }
    }
    if (pmVar12->next_merged != pmVar10->next_merged) {
      return -1;
    }
    pmVar12 = pmVar12->next;
    pmVar10 = pmVar10->next;
    if (pmVar10 == (mbedtls_asn1_named_data *)0x0 && pmVar12 == (mbedtls_asn1_named_data *)0x0) {
      if (top == 0) {
        bVar6 = true;
      }
      else {
        bVar6 = 2 < parent->version;
      }
      if (((bottom != 0 && top != 0) && (sVar4 = (child->raw).len, sVar4 == (parent->raw).len)) &&
         (iVar7 = bcmp((child->raw).p,(parent->raw).p,sVar4), iVar7 == 0)) {
        bVar6 = false;
      }
      if ((!bVar6) ||
         ((parent->ca_istrue != 0 &&
          (((parent->ext_types & 4) == 0 || ((parent->key_usage & 0x8005) == 4)))))) {
        iVar9 = 0;
      }
      return iVar9;
    }
  }
  return -1;
}

Assistant:

static int x509_crt_check_parent( const mbedtls_x509_crt *child,
                                  const mbedtls_x509_crt *parent,
                                  int top, int bottom )
{
    int need_ca_bit;

    /* Parent must be the issuer */
    if( x509_name_cmp( &child->issuer, &parent->subject ) != 0 )
        return( -1 );

    /* Parent must have the basicConstraints CA bit set as a general rule */
    need_ca_bit = 1;

    /* Exception: v1/v2 certificates that are locally trusted. */
    if( top && parent->version < 3 )
        need_ca_bit = 0;

    /* Exception: self-signed end-entity certs that are locally trusted. */
    if( top && bottom &&
        child->raw.len == parent->raw.len &&
        memcmp( child->raw.p, parent->raw.p, child->raw.len ) == 0 )
    {
        need_ca_bit = 0;
    }

    if( need_ca_bit && ! parent->ca_istrue )
        return( -1 );

#if defined(MBEDTLS_X509_CHECK_KEY_USAGE)
    if( need_ca_bit &&
        mbedtls_x509_crt_check_key_usage( parent, MBEDTLS_X509_KU_KEY_CERT_SIGN ) != 0 )
    {
        return( -1 );
    }
#endif

    return( 0 );
}